

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

bool __thiscall
libchars::command_cursor::find(command_cursor *this,string *search,filter_t mask,bool ignore_hidden)

{
  iterator *piVar1;
  char cVar2;
  ulong uVar3;
  char cVar4;
  _Elt_pointer ppcVar5;
  size_t sVar6;
  _Elt_pointer ppcVar7;
  ulong uVar8;
  command_node *pcVar9;
  undefined7 in_register_00000009;
  _Elt_pointer ppcVar10;
  command_node **__args;
  command_node *local_58;
  command_node *n;
  ulong local_48;
  ulong local_40;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000009,ignore_hidden);
  if (search->_M_string_length == 0) {
    return false;
  }
  uVar8 = 0;
  n = (command_node *)search;
  local_48 = uVar8;
  local_40 = mask;
LAB_0010b585:
  do {
    ppcVar7 = (this->S).c.
              super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    ppcVar10 = (this->S).c.
               super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppcVar10 == ppcVar7) {
      uVar3 = (n->part)._M_string_length;
      if ((this->root == (command_node *)0x0) || (uVar3 <= uVar8)) {
        if (this->root == (command_node *)0x0 || uVar8 < uVar3) {
          return (bool)0;
        }
        pcVar9 = this->root;
        if ((pcVar9->mask & local_40) == 0) {
          return (bool)0;
        }
LAB_0010b8e1:
        return (bool)(pcVar9->hidden ^ 1U | (byte)local_34);
      }
    }
    else {
      ppcVar5 = ppcVar10;
      if (ppcVar10 ==
          (this->S).c.
          super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppcVar5 = (this->S).c.
                  super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      uVar3 = (n->part)._M_string_length;
      if ((ppcVar5[-1] == (command_node *)0x0) || (uVar3 <= uVar8)) {
        ppcVar7 = ppcVar10;
        if (ppcVar10 ==
            (this->S).c.
            super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppcVar7 = (this->S).c.
                    super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        if (ppcVar7[-1] == (command_node *)0x0 || uVar8 < uVar3) {
          return (bool)0;
        }
        if (ppcVar10 ==
            (this->S).c.
            super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first) {
          if (((this->S).c.
               super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f]->mask & local_40) == 0) {
            return (bool)0;
          }
          ppcVar10 = (this->S).c.
                     super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        else if ((ppcVar10[-1]->mask & local_40) == 0) {
          return (bool)0;
        }
        pcVar9 = ppcVar10[-1];
        goto LAB_0010b8e1;
      }
    }
    cVar2 = (n->part)._M_dataplus._M_p[uVar8];
    uVar8 = this->idx;
    sVar6 = current_length(this);
    if (sVar6 <= uVar8) {
      if (ppcVar10 == ppcVar7) {
        pcVar9 = this->root;
        if (pcVar9->head == (command_node *)0x0) {
          return (bool)0;
        }
        if ((pcVar9->mask & local_40) == 0) {
          return (bool)0;
        }
        if (pcVar9->hidden == true && (byte)local_34 == '\0') {
          return (bool)0;
        }
      }
      else {
        ppcVar7 = (this->S).c.
                  super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first;
        ppcVar5 = ppcVar10;
        if (ppcVar10 == ppcVar7) {
          if ((this->S).c.
              super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f]->head ==
              (command_node *)0x0) {
            return (bool)0;
          }
          if (((this->S).c.
               super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f]->mask & local_40) == 0) {
            return (bool)0;
          }
          if ((this->S).c.
              super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f]->hidden == true &&
              (byte)local_34 == '\0') {
            return (bool)0;
          }
          if (ppcVar10 == ppcVar7) {
            ppcVar5 = (this->S).c.
                      super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
        }
        else {
          if (ppcVar10[-1]->head == (command_node *)0x0) {
            return (bool)0;
          }
          if ((ppcVar10[-1]->mask & local_40) == 0) {
            return (bool)0;
          }
          if (ppcVar10[-1]->hidden == true && (byte)local_34 == '\0') {
            return (bool)0;
          }
        }
        pcVar9 = ppcVar5[-1];
      }
      __args = &pcVar9->head;
      uVar8 = local_48;
      if (ppcVar10 !=
          (this->S).c.
          super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        *ppcVar10 = *__args;
        goto LAB_0010b809;
      }
LAB_0010b817:
      std::deque<libchars::command_node*,std::allocator<libchars::command_node*>>::
      _M_push_back_aux<libchars::command_node*const&>
                ((deque<libchars::command_node*,std::allocator<libchars::command_node*>> *)this,
                 __args);
LAB_0010b81c:
      this->idx = 0;
      goto LAB_0010b585;
    }
    cVar4 = current_char(this);
    uVar8 = local_48;
    if (cVar2 != cVar4) {
LAB_0010b79e:
      if (this->idx != 0) {
        return (bool)0;
      }
      ppcVar7 = (this->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppcVar7 ==
          (this->S).c.
          super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
          _M_impl.super__Deque_impl_data._M_start._M_cur) {
        return (bool)0;
      }
      if (ppcVar7 ==
          (this->S).c.
          super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppcVar7 = (this->S).c.
                  super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      local_58 = ppcVar7[-1]->next;
      if (local_58 == (command_node *)0x0) {
        return (bool)0;
      }
      std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>::pop_back
                ((deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_> *)this)
      ;
      ppcVar7 = (this->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppcVar7 ==
          (this->S).c.
          super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        __args = &local_58;
        goto LAB_0010b817;
      }
      *ppcVar7 = local_58;
LAB_0010b809:
      piVar1 = &(this->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
      goto LAB_0010b81c;
    }
    ppcVar7 = (this->S).c.
              super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppcVar7 !=
        (this->S).c.
        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
        _M_impl.super__Deque_impl_data._M_start._M_cur) {
      if (ppcVar7 ==
          (this->S).c.
          super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_first) {
        if (((this->S).c.
             super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f]->mask & local_40) != 0) {
          ppcVar7 = (this->S).c.
                    super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          goto LAB_0010b786;
        }
      }
      else if ((ppcVar7[-1]->mask & local_40) != 0) {
LAB_0010b786:
        pcVar9 = ppcVar7[-1];
        goto LAB_0010b78a;
      }
      goto LAB_0010b79e;
    }
    pcVar9 = this->root;
    if ((pcVar9->mask & local_40) == 0) goto LAB_0010b79e;
LAB_0010b78a:
    if ((pcVar9->hidden == true) && ((byte)local_34 == '\0')) goto LAB_0010b79e;
    uVar8 = local_48 + 1;
    this->idx = this->idx + 1;
    std::__cxx11::string::push_back((char)this + 'P');
    local_48 = uVar8;
  } while( true );
}

Assistant:

bool command_cursor::find(const std::string &search, command::filter_t mask, bool ignore_hidden)
    {
        if (search.empty())
            return false;

        size_t si = 0; // index into search (0..length)

        while (current() != NULL && si < search.length()) {
            char c = search.at(si);

            if (idx >= current_length()) {
                if (current()->head != NULL && (current()->mask & mask) != 0 && (!current()->hidden || ignore_hidden)) {
                    S.push(current()->head);
                    idx = 0;
                }
                else {
                    return false;
                }
            }
            else if (c == current_char() && (current()->mask & mask) != 0 && (!current()->hidden || ignore_hidden)) {
                ++si;
                ++idx;
                w += c;
            }
            else if (idx == 0) {
                if (S.empty()) {
                    return false;
                }
                command_node *n = S.top()->next;
                if (n != NULL) {
                    S.pop();
                    S.push(n);
                    idx = 0;
                }
                else {
                    return false;
                }
            }
            else {
                return false;
            }
        }

        return (current() != NULL && si >= search.length() && (current()->mask & mask) != 0 && (!current()->hidden || ignore_hidden));
    }